

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
Lodtalk::MethodCompiler::generateIfElse
          (MethodCompiler *this,MessageSendNode *node,Oop trueValue,Node *receiver,Node *trueBranch,
          Node *falseBranch,bool negated)

{
  Assembler *this_00;
  int iVar1;
  Label *destination;
  Label *destination_00;
  
  this_00 = &this->gen;
  destination = MethodAssembler::Assembler::makeLabel(this_00);
  destination_00 = MethodAssembler::Assembler::makeLabel(this_00);
  (*receiver->_vptr_Node[2])(receiver,this);
  if (trueValue.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&TrueObject) {
    MethodAssembler::Assembler::jumpOnFalse(this_00,destination);
  }
  else if (trueValue.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&FalseObject) {
    MethodAssembler::Assembler::jumpOnTrue(this_00,destination);
  }
  else {
    MethodAssembler::Assembler::pushLiteral(this_00,trueValue);
    MethodAssembler::Assembler::identityEqual(this_00);
    if (negated) {
      MethodAssembler::Assembler::jumpOnTrue(this_00,destination);
    }
    else {
      MethodAssembler::Assembler::jumpOnFalse(this_00,destination);
    }
  }
  (*trueBranch->_vptr_Node[2])(trueBranch,this);
  iVar1 = (*trueBranch->_vptr_Node[5])(trueBranch);
  if ((char)iVar1 == '\0') {
    MethodAssembler::Assembler::sendValue(this_00);
  }
  MethodAssembler::Assembler::jump(this_00,destination_00);
  MethodAssembler::Assembler::putLabel(this_00,destination);
  if (falseBranch == (Node *)0x0) {
    MethodAssembler::Assembler::pushNil(this_00);
  }
  else {
    (*falseBranch->_vptr_Node[2])(falseBranch,this);
    iVar1 = (*falseBranch->_vptr_Node[5])(falseBranch);
    if ((char)iVar1 == '\0') {
      MethodAssembler::Assembler::sendValue(this_00);
    }
  }
  MethodAssembler::Assembler::putLabel(this_00,destination_00);
  return;
}

Assistant:

void MethodCompiler::generateIfElse(MessageSendNode *node, Oop trueValue, Node *receiver, Node *trueBranch, Node *falseBranch, bool negated)
{
    auto elseLabel = gen.makeLabel();
    auto mergeLabel = gen.makeLabel();

    // Evaluate the condition.
    receiver->acceptVisitor(this);

    // Compare the condition to the true value.
    if(trueValue == trueOop())
    {
        gen.jumpOnFalse(elseLabel);
    }
    else if(trueValue == falseOop())
    {
        gen.jumpOnTrue(elseLabel);
    }
    else
    {
        gen.pushLiteral(trueValue);
        gen.identityEqual();
        if(negated)
            gen.jumpOnTrue(elseLabel);
        else
            gen.jumpOnFalse(elseLabel);
    }

    // Generate the true branch.
    trueBranch->acceptVisitor(this);
    if(!trueBranch->isBlockExpression())
        gen.sendValue();
    gen.jump(mergeLabel);

    // Generate the false branch.
    gen.putLabel(elseLabel);
    if(falseBranch)
    {
        falseBranch->acceptVisitor(this);
        if(!falseBranch->isBlockExpression())
            gen.sendValue();
    }
    else
        gen.pushNil();

    // Merge the control flow.
    gen.putLabel(mergeLabel);
}